

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

void Gia_QbfDumpFile(Gia_Man_t *pGia,int nPars)

{
  int *piVar1;
  int iVar2;
  Cnf_Dat_t *p;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  char *pFileName_00;
  bool bVar4;
  int local_4c;
  int Entry;
  int i;
  char *pFileName;
  Gia_Obj_t *pObj;
  Vec_Int_t *vExists;
  Vec_Int_t *vForAlls;
  Vec_Int_t *vVarMap;
  Cnf_Dat_t *pCnf;
  int nPars_local;
  Gia_Man_t *pGia_local;
  
  p = Mf_ManGenerateCnf(pGia,8,0,1,0);
  p_00 = Vec_IntStart(p->nVars);
  local_4c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pGia->vCis);
    bVar4 = false;
    if (local_4c < iVar2) {
      pGVar3 = Gia_ManCi(pGia,local_4c);
      bVar4 = pGVar3 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    if (local_4c < nPars) {
      piVar1 = p->pVarNums;
      iVar2 = Gia_ManCiIdToId(pGia,local_4c);
      Vec_IntWriteEntry(p_00,piVar1[iVar2],1);
    }
    local_4c = local_4c + 1;
  }
  p_01 = Vec_IntAlloc(nPars);
  iVar2 = Gia_ManCiNum(pGia);
  p_02 = Vec_IntAlloc(iVar2 - nPars);
  for (local_4c = 0; iVar2 = Vec_IntSize(p_00), local_4c < iVar2; local_4c = local_4c + 1) {
    iVar2 = Vec_IntEntry(p_00,local_4c);
    if (iVar2 == 0) {
      Vec_IntPush(p_02,local_4c);
    }
    else {
      Vec_IntPush(p_01,local_4c);
    }
  }
  pFileName_00 = Extra_FileNameGenericAppend(pGia->pSpec,".qdimacs");
  Cnf_DataWriteIntoFile(p,pFileName_00,0,p_01,p_02);
  Cnf_DataFree(p);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(p_00);
  printf("The 2QBF formula was written into file \"%s\".\n",pFileName_00);
  return;
}

Assistant:

void Gia_QbfDumpFile( Gia_Man_t * pGia, int nPars )
{
    // original problem: \exists p \forall x \exists y.  M(p,x,y)
    // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( pGia, 8, 0, 1, 0 );
    Vec_Int_t * vVarMap, * vForAlls, * vExists;
    Gia_Obj_t * pObj;
    char * pFileName;
    int i, Entry;
    // create var map
    vVarMap = Vec_IntStart( pCnf->nVars );
    Gia_ManForEachCi( pGia, pObj, i )
        if ( i < nPars )
            Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Gia_ManCiIdToId(pGia, i)], 1 );
    // create various maps
    vForAlls = Vec_IntAlloc( nPars );
    vExists = Vec_IntAlloc( Gia_ManCiNum(pGia) - nPars );
    Vec_IntForEachEntry( vVarMap, Entry, i )
        if ( Entry )
            Vec_IntPush( vForAlls, i );
        else
            Vec_IntPush( vExists, i );
    // generate CNF
    pFileName = Extra_FileNameGenericAppend( pGia->pSpec, ".qdimacs" );
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vForAlls );
    Vec_IntFree( vExists );
    Vec_IntFree( vVarMap );
    printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
}